

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,ValueType type)

{
  char *__s;
  ValueType in_ESI;
  Value *in_RDI;
  
  initBasic(in_RDI,in_ESI,false);
  switch(in_ESI) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    (in_RDI->value_).int_ = 0;
    break;
  case realValue:
    (in_RDI->value_).int_ = 0;
    break;
  case stringValue:
    (in_RDI->value_).int_ = 0;
    break;
  case booleanValue:
    (in_RDI->value_).bool_ = false;
    break;
  case arrayValue:
  case objectValue:
    __s = (char *)operator_new(0x30);
    memset(__s,0,0x30);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x156a5f);
    (in_RDI->value_).string_ = __s;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x152,"Json::Value::Value(ValueType)");
  }
  return;
}

Assistant:

Value::Value(ValueType type) {
  initBasic(type);
  switch (type) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    value_.int_ = 0;
    break;
  case realValue:
    value_.real_ = 0.0;
    break;
  case stringValue:
    value_.string_ = 0;
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues();
    break;
  case booleanValue:
    value_.bool_ = false;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}